

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O3

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteractionsFrom
          (BinaryPolynomialModel<unsigned_int,_double> *this,
          PolynomialKeyList<unsigned_int> *key_list,PolynomialValueList<double> *value_list,
          Vartype vartype)

{
  pointer pvVar1;
  runtime_error *this_00;
  ulong uVar2;
  long lVar3;
  pointer pvVar4;
  long lVar5;
  
  pvVar4 = (key_list->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (key_list->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pvVar1 - (long)pvVar4 >> 3) * -0x5555555555555555 -
      ((long)(value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3) == 0) {
    if (pvVar1 != pvVar4) {
      lVar3 = 0;
      lVar5 = 0;
      uVar2 = 0;
      do {
        AddInteraction(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            ((long)&(pvVar4->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + lVar5),
                       (double *)
                       ((long)(value_list->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar3),vartype);
        uVar2 = uVar2 + 1;
        pvVar4 = (key_list->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x18;
        lVar3 = lVar3 + 8;
      } while (uVar2 < (ulong)(((long)(key_list->
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >>
                               3) * -0x5555555555555555));
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The sizes of key_list and value_list must match each other");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AddInteractionsFrom(
        PolynomialKeyList<IndexType> &key_list,
        const PolynomialValueList<FloatType> &value_list,
        const Vartype vartype = Vartype::NONE ) {
      if ( key_list.size() != value_list.size() ) {
        throw std::runtime_error( "The sizes of key_list and value_list must match each other" );
      }
      for ( std::size_t i = 0; i < key_list.size(); ++i ) {
        AddInteraction( key_list[ i ], value_list[ i ], vartype );
      }
    }